

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::ParseFncDeclHelper<false>
          (Parser *this,ParseNodeFnc *pnodeFnc,LPCOLESTR pNameHint,ushort flags,bool fUnaryOrParen,
          bool noStmtContext,bool *pNeedScanRCurly,bool skipFormals,IdentPtr *pFncNamePid,
          bool fAllowIn)

{
  BOOL BVar1;
  uint uVar2;
  uint uVar3;
  ParseNodeFnc *pPVar4;
  StmtNest *stmt;
  code *pcVar5;
  anon_class_24_3_9004dee7 fn;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  charcount_t cVar9;
  undefined4 *puVar10;
  ParseNodeFnc *pPVar11;
  Scanner_t *pSVar12;
  SourceDynamicProfileManager **ppSVar13;
  undefined8 uVar14;
  ScriptConfiguration *this_00;
  HashTbl *hashTbl;
  IdentPtr pid;
  size_t sVar15;
  ParseNodeFnc *pPVar16;
  bool bVar17;
  bool fLambda_00;
  bool bVar18;
  char16_t *local_260;
  Scope *local_248;
  undefined1 local_1f0 [8];
  RestorePoint afterFnc;
  BOOL hadNewLine;
  Scope *paramScope;
  ParseNodeBlock *pPStack_180;
  bool strictModeTurnedOn;
  ParseNodeBlock *pnodeInnerBlock;
  DeferredFunctionStub *savedStub;
  byte local_165;
  uint savedStubCount;
  bool fLambdaParamsSave;
  ParseNodePtr *ppPStack_160;
  uint parenExprDepthSave;
  ParseNodePtr *ppnodeExprScopeSave;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeVarSave;
  ParseNodeVar *argNode;
  ParseNodePtr *varNodesList;
  ParseNodeBlock *pnodeBlock;
  ParseNodeFnc *local_120;
  ParseNodeFnc *pnodeRealFnc;
  undefined1 local_110 [6];
  bool parallelJobStarted;
  bool doParallel;
  AutoFastScanFlag flag;
  bool isTopLevelDeferredFunc;
  uint uDeferSave;
  uint uCanDeferSave;
  BOOL oldStrictMode;
  BOOL fWasAlreadyStrictMode;
  RestorePoint beginFormals;
  bool topLevelStmt;
  bool fPreviousAwaitIsKeyword;
  Scope *pSStack_a8;
  bool fPreviousYieldIsKeyword;
  Scope *fncExprScope;
  ParseNodeBlock *pnodeFncExprScope;
  RestorePoint beginNameHint;
  bool fFunctionInBlock;
  StmtNest *pstmtSave;
  bool fDeferred;
  bool fModule;
  bool fAsync;
  bool fLambda;
  bool fDeclaration;
  int32 *pAstSizeSave;
  ParseNodeFnc *pnodeFncSaveNonLambda;
  ParseNodeFnc *pnodeFncSave;
  ParseNodeFnc *pnodeFncParent;
  bool fAllowIn_local;
  bool skipFormals_local;
  bool noStmtContext_local;
  bool fUnaryOrParen_local;
  ushort flags_local;
  LPCOLESTR pNameHint_local;
  ParseNodeFnc *pnodeFnc_local;
  Parser *this_local;
  
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x15db,"(pnodeFnc)","pnodeFnc");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pPVar11 = GetCurrentFunctionNode(this);
  pPVar16 = this->m_currentNodeDeferredFunc;
  pPVar4 = this->m_currentNodeNonLambdaDeferredFunc;
  bVar17 = (flags & 1) != 0;
  fLambda_00 = (flags & 0x10) != 0;
  bVar18 = (flags & 0x200) == 0;
  bVar6 = false;
  beginNameHint.m_cMultiUnits._7_1_ = 0;
  RestorePoint::RestorePoint((RestorePoint *)&pnodeFncExprScope);
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar12,(RestorePoint *)&pnodeFncExprScope);
  fncExprScope = (Scope *)0x0;
  pSStack_a8 = (Scope *)0x0;
  if (!bVar17) {
    if (!fLambda_00) {
      fncExprScope = (Scope *)StartParseBlock<false>
                                        (this,Function,ScopeType_FuncExpr,(LabelId *)0x0);
      pSStack_a8 = ((ParseNodeBlock *)fncExprScope)->scope;
    }
    UpdateCurrentNodeFunc<false>(this,pnodeFnc,fLambda_00);
  }
  if ((!fLambda_00) && (bVar18)) {
    ParseFncName<false>(this,pnodeFnc,flags,pFncNamePid);
  }
  if (bVar17) {
    UpdateCurrentNodeFunc<false>(this,pnodeFnc,fLambda_00);
  }
  if ((noStmtContext) && (bVar17 = ParseNodeFnc::IsGenerator(pnodeFnc), bVar17)) {
    Error(this,-0x7ff5fc16,&pnodeFnc->super_ParseNode);
  }
  pSVar12 = GetScanner(this);
  bVar17 = ParseNodeFnc::IsGenerator(pnodeFnc);
  beginFormals.m_cMultiUnits._7_1_ =
       Scanner<UTF8EncodingPolicyBase<false>_>::SetYieldIsKeywordRegion(pSVar12,bVar17);
  pSVar12 = GetScanner(this);
  beginFormals.m_cMultiUnits._6_1_ =
       Scanner<UTF8EncodingPolicyBase<false>_>::SetAwaitIsKeywordRegion
                 (pSVar12,(flags & 0x100) != 0);
  ParseNodeFnc::IsGenerator(pnodeFnc);
  if ((pSStack_a8 != (Scope *)0x0) && (pnodeFnc->pnodeName == (ParseNodeVar *)0x0)) {
    FinishParseBlock(this,(ParseNodeBlock *)fncExprScope,true);
    this->m_nextBlockId = this->m_nextBlockId + -1;
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Scope>
              (&this->m_nodeAllocator,pSStack_a8);
    pSStack_a8 = (Scope *)0x0;
    fncExprScope = (Scope *)0x0;
  }
  pnodeFnc->scope = pSStack_a8;
  beginFormals.m_cMultiUnits._5_1_ = 0;
  stmt = this->m_pstmtCur;
  SetCurrentStatement(this,(StmtNest *)0x0);
  RestorePoint::RestorePoint((RestorePoint *)&oldStrictMode);
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar12,(RestorePoint *)&oldStrictMode);
  bVar17 = IsStrictMode(this);
  BVar1 = this->m_fUseStrictMode;
  uVar2 = this->m_grfscr;
  uVar3 = this->m_grfscr;
  flag.m_parser._7_1_ = 0;
  ParseFncDeclHelper<false>::AutoFastScanFlag::AutoFastScanFlag((AutoFastScanFlag *)local_110,this);
  pnodeRealFnc._7_1_ = 0;
  pnodeRealFnc._6_1_ = 0;
  local_120 = pnodeFnc;
  if (pnodeFnc == (ParseNodeFnc *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x169b,"(pnodeFnc)","pnodeFnc");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  varNodesList = (ParseNodePtr *)
                 StartParseBlock<false>(this,Parameter,ScopeType_Parameter,(LabelId *)0x0);
  if ((ParseNodeBlock *)varNodesList == (ParseNodeBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x169d,"(pnodeBlock != nullptr)","pnodeBlock != nullptr");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pnodeFnc->pnodeScopes = (ParseNodeBlock *)varNodesList;
  this->m_ppnodeVar = &pnodeFnc->pnodeParams;
  pnodeFnc->pnodeVars = (ParseNodePtr)0x0;
  argNode = (ParseNodeVar *)&pnodeFnc->pnodeVars;
  ppnodeVarSave = (ParseNodePtr *)0x0;
  if ((bVar18) && (!fLambda_00)) {
    ppnodeScopeSave = this->m_ppnodeVar;
    this->m_ppnodeVar = &pnodeFnc->pnodeVars;
    ppnodeVarSave = (ParseNodePtr *)AddArgumentsNodeToVars(this,pnodeFnc);
    argNode = (ParseNodeVar *)this->m_ppnodeVar;
    this->m_ppnodeVar = ppnodeScopeSave;
  }
  ppnodeExprScopeSave = this->m_ppnodeScope;
  if (varNodesList != (ParseNodePtr *)0x0) {
    this->m_ppnodeScope = varNodesList + 7;
    varNodesList[4] = &pnodeFnc->super_ParseNode;
  }
  ppPStack_160 = this->m_ppnodeExprScope;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  savedStubCount = this->m_funcParenExprDepth;
  this->m_funcParenExprDepth = 0;
  if (!skipFormals) {
    local_165 = this->m_reparsingLambdaParams & 1;
    if (fLambda_00) {
      this->m_reparsingLambdaParams = true;
    }
    savedStub._4_4_ = this->m_currDeferredStubCount;
    pnodeInnerBlock = (ParseNodeBlock *)this->m_currDeferredStub;
    ShiftCurrDeferredStubToChildFunction(this,pnodeFnc,pPVar11);
    ParseFncFormals<false>(this,pnodeFnc,pPVar11,flags,(bool)(flag.m_parser._7_1_ & 1));
    this->m_currDeferredStub = (DeferredFunctionStub *)pnodeInnerBlock;
    this->m_currDeferredStubCount = savedStub._4_4_;
    this->m_reparsingLambdaParams = (bool)(local_165 & 1);
  }
  pPStack_180 = StartParseBlock<false>(this,Function,ScopeType_FunctionBody,(LabelId *)0x0);
  *this->m_ppnodeScope = (ParseNodePtr)pPStack_180;
  pnodeFnc->pnodeBodyScope = pPStack_180;
  this->m_ppnodeScope = &pPStack_180->pnodeScopes;
  pPStack_180->pnodeStmt = &pnodeFnc->super_ParseNode;
  paramScope._7_1_ = 0;
  if (((((((flag.m_parser._7_1_ & 1) != 0) && ((this->m_grfscr & 0x800) == 0)) &&
        (bVar7 = ParseNodeFnc::IsNested(pnodeFnc), bVar7)) &&
       ((ppSVar13 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                              ((WriteBarrierPtr *)
                               &this->m_sourceContextInfo->sourceDynamicProfileManager),
        *ppSVar13 == (SourceDynamicProfileManager *)0x0 &&
        (bVar7 = Js::Phases::IsEnabled
                           ((Phases *)&DAT_01eb5b30,ScanAheadPhase,
                            this->m_sourceContextInfo->sourceContextId,pnodeFnc->functionId), bVar7)
        ))) && ((bVar7 = Js::Phases::IsEnabled
                                   ((Phases *)&DAT_01ea41a0,DeferParsePhase,
                                    this->m_sourceContextInfo->sourceContextId,pnodeFnc->functionId)
                , !bVar7 ||
                (bVar7 = Js::Phases::IsEnabled
                                   ((Phases *)&DAT_01ea41a0,ScanAheadPhase,
                                    this->m_sourceContextInfo->sourceContextId,pnodeFnc->functionId)
                , bVar7)))) && (bVar7 = ScanAheadToFunctionEnd(this,DAT_01eafdc4), bVar7)) {
    flag.m_parser._7_1_ = 0;
  }
  if (pnodeFnc->pnodeScopes == (ParseNodeBlock *)0x0) {
    local_248 = (Scope *)0x0;
  }
  else {
    local_248 = pnodeFnc->pnodeScopes->scope;
  }
  if (local_248 != (Scope *)0x0) {
    if ((DAT_01ea9eea & 1) == 0) {
      bVar7 = ParseNodeFnc::HasNonSimpleParameterList(pnodeFnc);
      if ((bVar7) && (bVar7 = ParseNodeFnc::IsBodyAndParamScopeMerged(pnodeFnc), bVar7)) {
        fn.paramScope = local_248;
        fn.this = this;
        fn.pnodeFnc = pnodeFnc;
        Scope::
        ForEachSymbolUntil<Parser::ParseFncDeclHelper<false>(ParseNodeFnc*,char16_t_const*,unsigned_short,bool,bool,bool*,bool,Ident**,bool)::_lambda(Symbol*)_1_>
                  (local_248,fn);
      }
    }
    else {
      ParseNodeFnc::ResetBodyAndParamScopeMerged(pnodeFnc);
    }
  }
  if ((local_248 != (Scope *)0x0) &&
     (bVar7 = ParseNodeFnc::IsBodyAndParamScopeMerged(pnodeFnc), bVar7)) {
    Scope::
    ForEachSymbol<Parser::ParseFncDeclHelper<false>(ParseNodeFnc*,char16_t_const*,unsigned_short,bool,bool,bool*,bool,Ident**,bool)::_lambda(Symbol*)_2_>
              (local_248,(anon_class_8_1_8991fb9c)this);
  }
  if (this->m_funcParenExprDepth != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x172c,"(m_funcParenExprDepth == 0)",
                       "Paren exprs should have been resolved by the time we finish function formals"
                      );
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((((fLambda_00) && ((this->m_InAsmMode & 1U) != 0)) && ((flag.m_parser._7_1_ & 1) != 0)) &&
     ((this->m_deferAsmJs & 1U) != 0)) {
    Js::AsmJSCompiler::OutputError(this->m_scriptContext,L"Lambda functions are not supported.");
    Js::AsmJSCompiler::OutputError(this->m_scriptContext,L"Asm.js compilation failed.");
    uVar14 = __cxa_allocate_exception(1);
    __cxa_throw(uVar14,&Js::AsmJsParseException::typeinfo,0);
  }
  if ((this->m_token).tk == tkRParen) {
    pSVar12 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
  }
  if (fLambda_00) {
    pSVar12 = GetScanner(this);
    afterFnc.m_cMultiUnits._4_4_ = Scanner<UTF8EncodingPolicyBase<false>_>::FHadNewLine(pSVar12);
    ChkCurTok(this,0x55,-0x7ff5fbda);
    if (afterFnc.m_cMultiUnits._4_4_ != 0) {
      Error(this,-0x7ff5fb4b,L"Lambda parameter list",L"\'=>\' on the same line");
    }
  }
  if (((flag.m_parser._7_1_ & 1) == 0) &&
     (((this->m_InAsmMode & 1U) == 0 || ((this->m_deferAsmJs & 1U) == 0)))) {
    if (pnodeFnc == (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x175a,"(pnodeFnc)","pnodeFnc");
      if (!bVar7) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    if (*this->m_ppnodeVar != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x175d,"(*m_ppnodeVar == nullptr)","*m_ppnodeVar == nullptr");
      if (!bVar7) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    this->m_ppnodeVar = (ParseNodePtr *)argNode;
    bVar7 = ParseNodeFnc::IsBodyAndParamScopeMerged(pnodeFnc);
    if (!bVar7) {
      if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
        local_260 = L"Anonymous function";
      }
      else {
        local_260 = Ident::Psz(pnodeFnc->pnodeName->pid);
      }
      Output::TraceWithFlush
                (ParsePhase,L"The param and body scope of the function %s cannot be merged\n",
                 local_260);
    }
    this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
    ParseNestedDeferredFunc
              (this,pnodeFnc,fLambda_00,pNeedScanRCurly,(bool *)((long)&paramScope + 7),fAllowIn);
  }
  else {
    bVar6 = true;
    ParseTopLevelDeferredFunc(this,pnodeFnc,pPVar16,pNameHint,fLambda_00,pNeedScanRCurly,fAllowIn);
  }
  this->m_funcParenExprDepth = savedStubCount;
  if (pPStack_180 != (ParseNodeBlock *)0x0) {
    FinishParseBlock(this,pPStack_180,(bool)(*pNeedScanRCurly & 1));
  }
  if ((bVar18) && (((this->m_token).tk == tkLCurly || (!fLambda_00)))) {
    UpdateArgumentsNode(this,pnodeFnc,(ParseNodeVar *)ppnodeVarSave);
  }
  CreateSpecialSymbolDeclarations(this,pnodeFnc);
  if ((this->m_ppnodeExprScope != (ParseNodePtr *)0x0) &&
     (*this->m_ppnodeExprScope != (ParseNodePtr)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1791,"(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr)",
                        "m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr");
    if (!bVar18) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this->m_ppnodeExprScope = ppPStack_160;
  if (this->m_ppnodeScope == (ParseNodePtr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1794,"(m_ppnodeScope)","m_ppnodeScope");
    if (!bVar18) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (*this->m_ppnodeScope != (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar18 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                        ,0x1795,"(nullptr == *m_ppnodeScope)","nullptr == *m_ppnodeScope");
    if (!bVar18) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this->m_ppnodeScope = ppnodeExprScopeSave;
  if (varNodesList != (ParseNodePtr *)0x0) {
    FinishParseBlock(this,(ParseNodeBlock *)varNodesList,(bool)(*pNeedScanRCurly & 1));
  }
  bVar18 = IsStrictMode(this);
  if ((bVar18) || ((paramScope._7_1_ & 1) != 0)) {
    this->m_fUseStrictMode = 1;
    if (!bVar17) {
      RestorePoint::RestorePoint((RestorePoint *)local_1f0);
      pSVar12 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar12,(RestorePoint *)local_1f0);
      if (pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
        pSVar12 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar12,(RestorePoint *)&pnodeFncExprScope);
        pSVar12 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
        bVar17 = ParseNodeFnc::IsGenerator(pnodeFnc);
        if (bVar17) {
          if ((this->m_token).tk != tkStar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar17 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17af,"(m_token.tk == tkStar)","m_token.tk == tkStar");
            if (!bVar17) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          this_00 = Js::ScriptContext::GetConfig(this->m_scriptContext);
          bVar17 = Js::ScriptConfiguration::IsES6GeneratorsEnabled(this_00);
          if (!bVar17) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar17 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17b0,"(m_scriptContext->GetConfig()->IsES6GeneratorsEnabled())",
                                "m_scriptContext->GetConfig()->IsES6GeneratorsEnabled()");
            if (!bVar17) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          if ((flags & 0x40) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar17 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                ,0x17b1,"(!(flags & fFncClassMember))","!(flags & fFncClassMember)")
            ;
            if (!bVar17) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pSVar12 = GetScanner(this);
          Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar12);
        }
        BVar8 = Token::IsReservedWord((Token *)&this->m_token);
        if (BVar8 != 0) {
          IdentifierExpectedError(this,&this->m_token);
        }
        hashTbl = GetHashTbl(this);
        pid = Token::GetIdentifier((Token *)&this->m_token,hashTbl);
        CheckStrictModeEvalArgumentsUsage(this,pid,(ParseNodePtr)0x0);
      }
      pSVar12 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekToForcingPid
                (pSVar12,(RestorePoint *)&oldStrictMode);
      CheckStrictFormalParameters(this);
      pSVar12 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar12,(RestorePoint *)local_1f0);
    }
    this->m_fUseStrictMode = BVar1;
  }
  ProcessCapturedNames(this,pnodeFnc);
  if (bVar6) {
    if (pnodeFnc == (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x17d3,"(pnodeFnc)","pnodeFnc");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pnodeFnc->pnodeVars = (ParseNodePtr)0x0;
  }
  pPVar11 = local_120;
  pNameHint_local = (LPCOLESTR)pnodeFnc;
  if ((pnodeRealFnc._6_1_ & 1) != 0) {
    pNameHint_local = (LPCOLESTR)local_120;
    this->m_currentNodeFunc = local_120;
    pSVar12 = GetScanner(this);
    cVar9 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar12);
    (pPVar11->super_ParseNode).ichLim = cVar9;
    pSVar12 = GetScanner(this);
    sVar15 = Scanner<UTF8EncodingPolicyBase<false>_>::IecpLimTok(pSVar12);
    pPVar11->cbLim = sVar15;
  }
  if (pNameHint_local == (LPCOLESTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x17e7,"(pnodeFnc)","pnodeFnc");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar6 = ParseNodeFnc::GetAsmjsMode((ParseNodeFnc *)pNameHint_local);
  if (bVar6) {
    this->m_InAsmMode = false;
  }
  if (this->m_pstmtCur != (StmtNest *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x17ee,"(nullptr == m_pstmtCur)","nullptr == m_pstmtCur");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  SetCurrentStatement(this,stmt);
  if (fncExprScope != (Scope *)0x0) {
    FinishParseFncExprScope(this,(ParseNodeFnc *)pNameHint_local,(ParseNodeBlock *)fncExprScope);
  }
  this->m_grfscr = uVar2 & 0x10 | this->m_grfscr;
  if (this->m_stoppedDeferredParse == 0) {
    this->m_grfscr = uVar3 & 8 | this->m_grfscr;
  }
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::SetYieldIsKeywordRegion
            (pSVar12,(bool)(beginFormals.m_cMultiUnits._7_1_ & 1));
  pSVar12 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::SetAwaitIsKeywordRegion
            (pSVar12,(bool)(beginFormals.m_cMultiUnits._6_1_ & 1));
  if ((ParseNodeFnc *)pNameHint_local != this->m_currentNodeDeferredFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x180e,"(pnodeFnc == m_currentNodeDeferredFunc)",
                       "pnodeFnc == m_currentNodeDeferredFunc");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (!fLambda_00) {
    if ((ParseNodeFnc *)pNameHint_local != this->m_currentNodeNonLambdaDeferredFunc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1811,"(pnodeFnc == m_currentNodeNonLambdaDeferredFunc)",
                         "pnodeFnc == m_currentNodeNonLambdaDeferredFunc");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    this->m_currentNodeNonLambdaDeferredFunc = pPVar4;
  }
  this->m_currentNodeDeferredFunc = pPVar16;
  if ((this->m_currentNodeFunc != (ParseNodeFnc *)0x0) &&
     (bVar6 = ParseNodeFnc::HasWithStmt((ParseNodeFnc *)pNameHint_local), bVar6)) {
    pPVar16 = GetCurrentFunctionNode(this);
    ParseNodeFnc::SetHasWithStmt(pPVar16,true);
  }
  ParseFncDeclHelper<false>::AutoFastScanFlag::~AutoFastScanFlag((AutoFastScanFlag *)local_110);
  return;
}

Assistant:

void Parser::ParseFncDeclHelper(ParseNodeFnc * pnodeFnc, LPCOLESTR pNameHint, ushort flags, bool fUnaryOrParen, bool noStmtContext, bool *pNeedScanRCurly, bool skipFormals, IdentPtr* pFncNamePid, bool fAllowIn)
{
    Assert(pnodeFnc);
    ParseNodeFnc * pnodeFncParent = GetCurrentFunctionNode();
    // is the following correct? When buildAST is false, m_currentNodeDeferredFunc can be nullptr on transition to deferred parse from non-deferred
    ParseNodeFnc * pnodeFncSave = buildAST ? m_currentNodeFunc : m_currentNodeDeferredFunc;
    ParseNodeFnc * pnodeFncSaveNonLambda = buildAST ? m_currentNodeNonLambdaFunc : m_currentNodeNonLambdaDeferredFunc;
    int32* pAstSizeSave = m_pCurrentAstSize;

    bool fDeclaration = (flags & fFncDeclaration) != 0;
    bool fLambda = (flags & fFncLambda) != 0;
    bool fAsync = (flags & fFncAsync) != 0;
    bool fModule = (flags & fFncModule) != 0;
    bool fDeferred = false;
    StmtNest *pstmtSave;
    bool fFunctionInBlock = false;

    if (buildAST)
    {
        fFunctionInBlock = GetCurrentBlockInfo() != GetCurrentFunctionBlockInfo() &&
            (GetCurrentBlockInfo()->pnodeBlock->scope == nullptr ||
                GetCurrentBlockInfo()->pnodeBlock->scope->GetScopeType() != ScopeType_GlobalEvalBlock);
    }

    // Save the position of the scanner in case we need to inspect the name hint later
    RestorePoint beginNameHint;
    this->GetScanner()->Capture(&beginNameHint);

    ParseNodeBlock * pnodeFncExprScope = nullptr;
    Scope *fncExprScope = nullptr;
    if (!fDeclaration)
    {
        if (!fLambda)
        {
            pnodeFncExprScope = StartParseBlock<buildAST>(PnodeBlockType::Function, ScopeType_FuncExpr);
            fncExprScope = pnodeFncExprScope->scope;
        }

        // Function expression: push the new function onto the stack now so that the name (if any) will be
        // local to the new function.

        this->UpdateCurrentNodeFunc<buildAST>(pnodeFnc, fLambda);
    }

    if (!fLambda && !fModule)
    {
        this->ParseFncName<buildAST>(pnodeFnc, flags, pFncNamePid);
    }

    if (fDeclaration)
    {
        // Declaration statement: push the new function now, after parsing the name, so the name is local to the
        // enclosing function.

        this->UpdateCurrentNodeFunc<buildAST>(pnodeFnc, fLambda);
    }

    if (noStmtContext && pnodeFnc->IsGenerator())
    {
        // Generator decl not allowed outside stmt context. (We have to wait until we've parsed the '*' to
        // detect generator.)
        Error(ERRsyntax, pnodeFnc);
    }

    // switch scanner to treat 'yield' as keyword in generator functions
    // or as an identifier in non-generator functions
    bool fPreviousYieldIsKeyword = this->GetScanner()->SetYieldIsKeywordRegion(pnodeFnc->IsGenerator());
    bool fPreviousAwaitIsKeyword = this->GetScanner()->SetAwaitIsKeywordRegion(fAsync);

    if (pnodeFnc->IsGenerator())
    {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Generator, m_scriptContext);
    }

    if (fncExprScope && pnodeFnc->pnodeName == nullptr)
    {
        FinishParseBlock(pnodeFncExprScope);
        m_nextBlockId--;
        Adelete(&m_nodeAllocator, fncExprScope);
        fncExprScope = nullptr;
        pnodeFncExprScope = nullptr;
    }

    pnodeFnc->scope = fncExprScope;

    // Start a new statement stack.
    bool topLevelStmt =
        buildAST &&
        !fFunctionInBlock &&
        (this->m_pstmtCur == nullptr || this->m_pstmtCur->pnodeStmt->nop == knopBlock);

    pstmtSave = m_pstmtCur;
    SetCurrentStatement(nullptr);

    RestorePoint beginFormals;
    this->GetScanner()->Capture(&beginFormals);
    BOOL fWasAlreadyStrictMode = IsStrictMode();
    BOOL oldStrictMode = this->m_fUseStrictMode;

    if (fLambda)
    {
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Lambda, m_scriptContext);
    }

    uint uCanDeferSave = m_grfscr & fscrCanDeferFncParse;
    uint uDeferSave = m_grfscr & fscrWillDeferFncParse;
    bool isTopLevelDeferredFunc = false;

#if ENABLE_BACKGROUND_PARSING
    struct AutoFastScanFlag {
        bool savedDoingFastScan;
        AutoFastScanFlag(Parser *parser) : m_parser(parser) { savedDoingFastScan = m_parser->m_doingFastScan; }
        ~AutoFastScanFlag() { m_parser->m_doingFastScan = savedDoingFastScan; }
        Parser *m_parser;
    } flag(this);
#endif

    bool doParallel = false;
#if ENABLE_BACKGROUND_PARSING
    bool parallelJobStarted = false;
#endif
    if (buildAST)
    {
        bool isLikelyIIFE = !fDeclaration && fUnaryOrParen;

        BOOL isDeferredFnc = IsDeferredFnc();
        // These are the conditions that prohibit upfront deferral *and* redeferral.
        isTopLevelDeferredFunc = 
                (m_grfscr & fscrCanDeferFncParse)
                && !m_InAsmMode
                // Don't defer a module function wrapper because we need to do export resolution at parse time
                && !fModule;

        pnodeFnc->SetCanBeDeferred(isTopLevelDeferredFunc && ParseNodeFnc::CanBeRedeferred(pnodeFnc->fncFlags));

        // These are heuristic conditions that prohibit upfront deferral but not redeferral.
        isTopLevelDeferredFunc = isTopLevelDeferredFunc && !isDeferredFnc && WillDeferParse(pnodeFnc->functionId) &&
            (!isLikelyIIFE || !topLevelStmt || PHASE_FORCE_RAW(Js::DeferParsePhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId));

#if ENABLE_BACKGROUND_PARSING
        if (!fLambda &&
            !isDeferredFnc &&
            !isLikelyIIFE &&
            !this->IsBackgroundParser() &&
            !this->m_doingFastScan &&
            !(pnodeFncSave && m_currDeferredStub) &&
            !(this->m_parseType == ParseType_Deferred && this->m_functionBody && this->m_functionBody->GetScopeInfo() && !isTopLevelDeferredFunc))
        {
            doParallel = DoParallelParse(pnodeFnc);

            if (doParallel)
            {
                BackgroundParser *bgp = m_scriptContext->GetBackgroundParser();
                Assert(bgp);
                if (bgp->HasFailedBackgroundParseItem())
                {
                    Error(ERRsyntax);
                }
                doParallel = bgp->ParseBackgroundItem(this, pnodeFnc, isTopLevelDeferredFunc);
                if (doParallel)
                {
                    parallelJobStarted = true;
                    this->m_hasParallelJob = true;
                    this->m_doingFastScan = true;
                    doParallel = FastScanFormalsAndBody();
                    if (doParallel)
                    {
                        // Let the foreground thread take care of marking the limit on the function node,
                        // because in some cases this function's caller will want to change that limit,
                        // so we don't want the background thread to try and touch it.
                        pnodeFnc->ichLim = this->GetScanner()->IchLimTok();
                        pnodeFnc->cbLim = this->GetScanner()->IecpLimTok();
                    }
                }
            }
        }
#endif
    }

    if (!doParallel)
    {
#if ENABLE_BACKGROUND_PARSING
        // We don't want to, or couldn't, let the main thread scan past this function body, so parse
        // it for real.
        ParseNodeFnc * pnodeRealFnc = pnodeFnc;
        if (parallelJobStarted)
        {
            // We have to deal with a failure to fast-scan the function (due to syntax error? "/"?) when
            // a background thread may already have begun to work on the job. Both threads can't be allowed to
            // operate on the same node.
            pnodeFnc = CreateDummyFuncNode(fDeclaration);
        }
#endif

        AnalysisAssert(pnodeFnc);
        ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Parameter, ScopeType_Parameter);
        AnalysisAssert(pnodeBlock != nullptr);
        pnodeFnc->pnodeScopes = pnodeBlock;
        m_ppnodeVar = &pnodeFnc->pnodeParams;
        pnodeFnc->pnodeVars = nullptr;
        ParseNodePtr* varNodesList = &pnodeFnc->pnodeVars;
        ParseNodeVar * argNode = nullptr;

        if (!fModule && !fLambda)
        {
            ParseNodePtr *const ppnodeVarSave = m_ppnodeVar;
            m_ppnodeVar = &pnodeFnc->pnodeVars;

            // Create the built-in arguments symbol
            argNode = this->AddArgumentsNodeToVars(pnodeFnc);

            // Save the updated var list
            varNodesList = m_ppnodeVar;
            m_ppnodeVar = ppnodeVarSave;
        }

        ParseNodePtr *ppnodeScopeSave = nullptr;
        ParseNodePtr *ppnodeExprScopeSave = nullptr;

        ppnodeScopeSave = m_ppnodeScope;
        if (pnodeBlock)
        {
            // This synthetic block scope will contain all the nested scopes.
            m_ppnodeScope = &pnodeBlock->pnodeScopes;
            pnodeBlock->pnodeStmt = pnodeFnc;
        }

        // Keep nested function declarations and expressions in the same list at function scope.
        // (Indicate this by nulling out the current function expressions list.)
        ppnodeExprScopeSave = m_ppnodeExprScope;
        m_ppnodeExprScope = nullptr;

        uint parenExprDepthSave = m_funcParenExprDepth;
        m_funcParenExprDepth = 0;

        if (!skipFormals)
        {
            bool fLambdaParamsSave = m_reparsingLambdaParams;
            if (fLambda)
            {
                m_reparsingLambdaParams = true;
            }

            uint savedStubCount = m_currDeferredStubCount;
            DeferredFunctionStub* savedStub = m_currDeferredStub;
            ShiftCurrDeferredStubToChildFunction(pnodeFnc, pnodeFncParent);

            this->ParseFncFormals<buildAST>(pnodeFnc, pnodeFncParent, flags, isTopLevelDeferredFunc);

            m_currDeferredStub = savedStub;
            m_currDeferredStubCount = savedStubCount;

            m_reparsingLambdaParams = fLambdaParamsSave;
        }

        // Create function body scope
        ParseNodeBlock * pnodeInnerBlock = StartParseBlock<buildAST>(PnodeBlockType::Function, ScopeType_FunctionBody);
        // Set the parameter block's child to the function body block.
        // The pnodeFnc->pnodeScopes list is constructed in such a way that it includes all the scopes in this list.
        // For example if the param scope has one function and body scope has one function then the list will look like below,
        // param scope block -> function decl from param scope -> body socpe block -> function decl from body scope.
        *m_ppnodeScope = pnodeInnerBlock;
        pnodeFnc->pnodeBodyScope = pnodeInnerBlock;

        // This synthetic block scope will contain all the nested scopes.
        m_ppnodeScope = &pnodeInnerBlock->pnodeScopes;
        pnodeInnerBlock->pnodeStmt = pnodeFnc;

        // DEFER: Begin deferral here (after names are parsed and name nodes created).
        // Create no more AST nodes until we're done.

        // Try to defer this func if all these are true:
        //  0. We are not already in deferred parsing (i.e. buildAST is true)
        //  1. We are not re-parsing a deferred func which is being invoked.
        //  2. Dynamic profile suggests this func can be deferred (and deferred parse is on).
        //  3. This func is top level or defer nested func is on.
        //  4. Optionally, the function is non-nested and not in eval, or the deferral decision was based on cached profile info,
        //     or the function is sufficiently long. (I.e., don't defer little nested functions unless we're
        //     confident they'll never be executed, because un-deferring nested functions is more expensive.)
        //     NOTE: I'm disabling #4 by default, because we've found other ways to reduce the cost of un-deferral,
        //           and we don't want to create function bodies aggressively for little functions.

        // We will also temporarily defer all asm.js functions, except for the asm.js
        // module itself, which we will never defer
        bool strictModeTurnedOn = false;

        if (isTopLevelDeferredFunc &&
            !(this->m_grfscr & fscrEvalCode) &&
            pnodeFnc->IsNested() &&
#ifndef DISABLE_DYNAMIC_PROFILE_DEFER_PARSE
            m_sourceContextInfo->sourceDynamicProfileManager == nullptr &&
#endif
            PHASE_ON_RAW(Js::ScanAheadPhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId) &&
            (
                !PHASE_FORCE_RAW(Js::DeferParsePhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId) ||
                PHASE_FORCE_RAW(Js::ScanAheadPhase, m_sourceContextInfo->sourceContextId, pnodeFnc->functionId)
                ))
        {
            // Try to scan ahead to the end of the function. If we get there before we've scanned a minimum
            // number of tokens, don't bother deferring, because it's too small.
            if (this->ScanAheadToFunctionEnd(CONFIG_FLAG(MinDeferredFuncTokenCount)))
            {
                isTopLevelDeferredFunc = false;
            }
        }

        Scope* paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
        if (paramScope != nullptr)
        {
            if (CONFIG_FLAG(ForceSplitScope))
            {
                pnodeFnc->ResetBodyAndParamScopeMerged();
            }
            else if (pnodeFnc->HasNonSimpleParameterList() && pnodeFnc->IsBodyAndParamScopeMerged())
            {
                paramScope->ForEachSymbolUntil([this, paramScope, pnodeFnc](Symbol* sym) {
                    if (sym->GetPid()->GetTopRef()->GetFuncScopeId() > pnodeFnc->functionId)
                    {
                        // One of the symbol has non local reference. Mark the param scope as we can't merge it with body scope.
                        pnodeFnc->ResetBodyAndParamScopeMerged();
                        return true;
                    }
                    return false;
                });
            }
        }

        // If the param scope is merged with the body scope we want to use the param scope symbols in the body scope.
        // So add a pid ref for the body using the param scope symbol. Note that in this case the same symbol will occur twice
        // in the same pid ref stack.
        if (paramScope != nullptr && pnodeFnc->IsBodyAndParamScopeMerged())
        {
            paramScope->ForEachSymbol([this](Symbol* paramSym)
            {
                PidRefStack* ref = PushPidRef(paramSym->GetPid());
                ref->SetSym(paramSym);
            });
        }

        AssertMsg(m_funcParenExprDepth == 0, "Paren exprs should have been resolved by the time we finish function formals");

        if (fLambda)
        {
#ifdef ASMJS_PLAT
            if (m_InAsmMode && (isTopLevelDeferredFunc && m_deferAsmJs))
            {
                // asm.js doesn't support lambda functions
                Js::AsmJSCompiler::OutputError(m_scriptContext, _u("Lambda functions are not supported."));
                Js::AsmJSCompiler::OutputError(m_scriptContext, _u("Asm.js compilation failed."));
                throw Js::AsmJsParseException();
            }
#endif
        }

        if (m_token.tk == tkRParen)
        {
            this->GetScanner()->Scan();
        }

        if (fLambda)
        {
            BOOL hadNewLine = this->GetScanner()->FHadNewLine();

            // it can be the case we do not have a fat arrow here if there is a valid expression on the left hand side
            // of the fat arrow, but that expression does not parse as a parameter list.  E.g.
            //    a.x => { }
            // Therefore check for it and error if not found.
            ChkCurTok(tkDArrow, ERRnoDArrow);

            // Newline character between arrow parameters and fat arrow is a syntax error but we want to check for
            // this after verifying there was a => token. Otherwise we would throw the wrong error.
            if (hadNewLine)
            {
                Error(ERRValidIfFollowedBy, _u("Lambda parameter list"), _u("'=>' on the same line"));
            }
        }

        if (isTopLevelDeferredFunc || (m_InAsmMode && m_deferAsmJs))
        {
            fDeferred = true;

            this->ParseTopLevelDeferredFunc(pnodeFnc, pnodeFncSave, pNameHint, fLambda, pNeedScanRCurly, fAllowIn);
        }
        else
        {
            AnalysisAssert(pnodeFnc);

            // Shouldn't be any temps in the arg list.
            Assert(*m_ppnodeVar == nullptr);

            // Start the var list.
            m_ppnodeVar = varNodesList;

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ParsePhase, _u("The param and body scope of the function %s cannot be merged\n"), pnodeFnc->pnodeName ? pnodeFnc->pnodeName->pid->Psz() : _u("Anonymous function"));
            }

            // Keep nested function declarations and expressions in the same list at function scope.
            // (Indicate this by nulling out the current function expressions list.)
            m_ppnodeExprScope = nullptr;

            if (buildAST)
            {
                if (m_token.tk != tkLCurly && fLambda)
                {
                    *pNeedScanRCurly = false;
                }
                uint savedStubCount = m_currDeferredStubCount;
                DeferredFunctionStub* savedStub = m_currDeferredStub;
                ShiftCurrDeferredStubToChildFunction(pnodeFnc, pnodeFncSave);

                this->FinishFncDecl(pnodeFnc, pNameHint, fLambda, skipFormals, fAllowIn);

                m_currDeferredStub = savedStub;
                m_currDeferredStubCount = savedStubCount;
            }
            else
            {
                this->ParseNestedDeferredFunc(pnodeFnc, fLambda, pNeedScanRCurly, &strictModeTurnedOn, fAllowIn);
            }
        }

        // Restore the paren count for any outer spread/rest error checking.
        m_funcParenExprDepth = parenExprDepthSave;

        if (pnodeInnerBlock)
        {
            FinishParseBlock(pnodeInnerBlock, *pNeedScanRCurly);
        }

        if (!fModule && (m_token.tk == tkLCurly || !fLambda))
        {
            UpdateArgumentsNode(pnodeFnc, argNode);
        }

        CreateSpecialSymbolDeclarations(pnodeFnc);

        // Restore the lists of scopes that contain function expressions.

        Assert(m_ppnodeExprScope == nullptr || *m_ppnodeExprScope == nullptr);
        m_ppnodeExprScope = ppnodeExprScopeSave;

        Assert(m_ppnodeScope);
        Assert(nullptr == *m_ppnodeScope);
        m_ppnodeScope = ppnodeScopeSave;

        if (pnodeBlock)
        {
            FinishParseBlock(pnodeBlock, *pNeedScanRCurly);
        }

        if (IsStrictMode() || strictModeTurnedOn)
        {
            this->m_fUseStrictMode = TRUE; // Now we know this function is in strict mode

            if (!fWasAlreadyStrictMode)
            {
                // If this function turned on strict mode then we didn't check the formal
                // parameters or function name hint for future reserved word usage. So do that now.
                RestorePoint afterFnc;
                this->GetScanner()->Capture(&afterFnc);

                if (pnodeFnc->pnodeName != nullptr)
                {
                    // Rewind to the function name hint and check if the token is a reserved word.
                    this->GetScanner()->SeekTo(beginNameHint);
                    this->GetScanner()->Scan();
                    if (pnodeFnc->IsGenerator())
                    {
                        Assert(m_token.tk == tkStar);
                        Assert(m_scriptContext->GetConfig()->IsES6GeneratorsEnabled());
                        Assert(!(flags & fFncClassMember));
                        this->GetScanner()->Scan();
                    }
                    if (m_token.IsReservedWord())
                    {
                        IdentifierExpectedError(m_token);
                    }
                    CheckStrictModeEvalArgumentsUsage(m_token.GetIdentifier(this->GetHashTbl()));
                }

                // Fast forward to formal parameter list, check for future reserved words,
                // then restore scanner as it was.
                this->GetScanner()->SeekToForcingPid(beginFormals);
                CheckStrictFormalParameters();
                this->GetScanner()->SeekTo(afterFnc);
            }

            if (buildAST)
            {
                if (pnodeFnc->pnodeName != nullptr)
                {
                    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
                    CheckStrictModeEvalArgumentsUsage(pnodeFnc->pnodeName->pid, pnodeFnc->pnodeName);
                }
            }

            this->m_fUseStrictMode = oldStrictMode;
            CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StrictModeFunction, m_scriptContext);
        }

        ProcessCapturedNames(pnodeFnc);

        if (fDeferred)
        {
            AnalysisAssert(pnodeFnc);
            pnodeFnc->pnodeVars = nullptr;
        }

#if ENABLE_BACKGROUND_PARSING
        if (parallelJobStarted)
        {
            pnodeFnc = pnodeRealFnc;
            m_currentNodeFunc = pnodeRealFnc;

            // Let the foreground thread take care of marking the limit on the function node,
            // because in some cases this function's caller will want to change that limit,
            // so we don't want the background thread to try and touch it.
            pnodeFnc->ichLim = this->GetScanner()->IchLimTok();
            pnodeFnc->cbLim = this->GetScanner()->IecpLimTok();
        }
#endif
    }

    // after parsing asm.js module, we want to reset asm.js state before continuing
    AnalysisAssert(pnodeFnc);
    if (pnodeFnc->GetAsmjsMode())
    {
        m_InAsmMode = false;
    }

    // Restore the statement stack.
    Assert(nullptr == m_pstmtCur);
    SetCurrentStatement(pstmtSave);

    if (pnodeFncExprScope)
    {
        FinishParseFncExprScope(pnodeFnc, pnodeFncExprScope);
    }
    m_grfscr |= uCanDeferSave;
    if (!m_stoppedDeferredParse)
    {
        m_grfscr |= uDeferSave;
    }

    this->GetScanner()->SetYieldIsKeywordRegion(fPreviousYieldIsKeyword);
    this->GetScanner()->SetAwaitIsKeywordRegion(fPreviousAwaitIsKeyword);

    // Restore the current function.
    if (buildAST)
    {
        Assert(pnodeFnc == m_currentNodeFunc);

        m_currentNodeFunc = pnodeFncSave;
        m_pCurrentAstSize = pAstSizeSave;

        if (!fLambda)
        {
            Assert(pnodeFnc == m_currentNodeNonLambdaFunc);
            m_currentNodeNonLambdaFunc = pnodeFncSaveNonLambda;
        }
    }
    else
    {
        Assert(pnodeFnc == m_currentNodeDeferredFunc);
        if (!fLambda)
        {
            Assert(pnodeFnc == m_currentNodeNonLambdaDeferredFunc);
            m_currentNodeNonLambdaDeferredFunc = pnodeFncSaveNonLambda;
        }
        m_currentNodeDeferredFunc = pnodeFncSave;
    }

    if (m_currentNodeFunc && pnodeFnc->HasWithStmt())
    {
        GetCurrentFunctionNode()->SetHasWithStmt(true);
    }
}